

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall ncnn::Crop::load_param(Crop *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->woffset = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->hoffset = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->coffset = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->outw = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->outh = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->outc = iVar1;
  if ((iVar1 != 0 || this->outw != 0) || this->outh != 0) {
    (this->super_Layer).one_blob_only = true;
  }
  return 0;
}

Assistant:

int Crop::load_param(const ParamDict& pd)
{
    woffset = pd.get(0, 0);
    hoffset = pd.get(1, 0);
    coffset = pd.get(2, 0);
    outw = pd.get(3, 0);
    outh = pd.get(4, 0);
    outc = pd.get(5, 0);

    if (outw != 0 || outh != 0 || outc != 0)
    {
        one_blob_only = true;
    }

    return 0;
}